

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alSourceRewindv(ALsizei n,ALuint *names)

{
  int local_1c;
  ALsizei i;
  ALuint *names_local;
  ALsizei n_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alSourceRewindv);
  IO_ALSIZEI(n);
  IO_PTR(names);
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    IO_UINT32(names[local_1c]);
  }
  (*REAL_alSourceRewindv)(n,names);
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    check_source_state_from_name(names[local_1c]);
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alSourceRewindv(ALsizei n, const ALuint *names)
{
    ALsizei i;

    IO_START(alSourceRewindv);
    IO_ALSIZEI(n);
    IO_PTR(names);
    for (i = 0; i < n; i++) {
        IO_UINT32(names[i]);
    }

    REAL_alSourceRewindv(n, names);

    for (i = 0; i < n; i++) {
        check_source_state_from_name(names[i]);
    }

    IO_END();
}